

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_graphicsmagick_external
          (CImg<unsigned_char> *this,char *filename)

{
  int iVar1;
  FILE *pFVar2;
  CImg<char> *pCVar3;
  char *pcVar4;
  char *pcVar5;
  CImgArgumentException *this_00;
  CImgIOException *this_01;
  ulong uVar6;
  char *pcVar7;
  CImg<char> filename_tmp;
  CImg<char> command;
  CImg<char> local_70;
  CImg<char> s_filename;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar7 = "non-";
    if (this->_is_shared != false) {
      pcVar7 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar7,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  pFVar2 = cimg::fopen(filename,"rb");
  cimg::fclose(pFVar2);
  CImg<char>::CImg(&command,0x400,1,1,1);
  CImg<char>::CImg(&filename_tmp,0x100,1,1,1);
  CImg<char>::string(&local_70,filename,true,false);
  pCVar3 = CImg<char>::_system_strescape(&local_70);
  CImg<char>::CImg(&s_filename,pCVar3);
  CImg<char>::~CImg(&local_70);
  iVar1 = cimg::system("which gm");
  pcVar7 = command._data;
  if (iVar1 == 0) {
    uVar6 = (ulong)command._width;
    pcVar4 = cimg::graphicsmagick_path((char *)0x0,false);
    snprintf(pcVar7,uVar6,"%s convert \"%s\" pnm:-",pcVar4,s_filename._data);
    pFVar2 = popen(command._data,"r");
    if (pFVar2 != (FILE *)0x0) {
      cimg::exception_mode(0);
      load_pnm(this,(FILE *)pFVar2);
      pclose(pFVar2);
      goto LAB_001b1a49;
    }
  }
  while( true ) {
    pcVar7 = filename_tmp._data;
    uVar6 = (ulong)filename_tmp._width;
    pcVar4 = cimg::temporary_path((char *)0x0,false);
    pcVar5 = cimg::filenamerand();
    snprintf(pcVar7,uVar6,"%s%c%s.pnm",pcVar4,0x2f,pcVar5);
    pFVar2 = fopen(filename_tmp._data,"rb");
    pcVar7 = command._data;
    if (pFVar2 == (FILE *)0x0) break;
    cimg::fclose(pFVar2);
  }
  pcVar4 = cimg::graphicsmagick_path((char *)0x0,false);
  CImg<char>::string(&local_70,filename_tmp._data,true,false);
  pCVar3 = CImg<char>::_system_strescape(&local_70);
  snprintf(pcVar7,(ulong)command._width,"%s convert \"%s\" \"%s\"",pcVar4,s_filename._data,
           pCVar3->_data);
  CImg<char>::~CImg(&local_70);
  cimg::graphicsmagick_path((char *)0x0,false);
  cimg::system(command._data);
  pFVar2 = fopen(filename_tmp._data,"rb");
  if (pFVar2 == (FILE *)0x0) {
    pFVar2 = cimg::fopen(filename,"r");
    cimg::fclose(pFVar2);
    this_01 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar7 = "non-";
    if (this->_is_shared != false) {
      pcVar7 = "";
    }
    CImgIOException::CImgIOException
              (this_01,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_graphicsmagick_external(): Failed to load file \'%s\' with external command \'gm\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar7,"unsigned char",filename);
    __cxa_throw(this_01,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  cimg::fclose(pFVar2);
  load_pnm(this,filename_tmp._data);
  remove(filename_tmp._data);
LAB_001b1a49:
  CImg<char>::~CImg(&s_filename);
  CImg<char>::~CImg(&filename_tmp);
  CImg<char>::~CImg(&command);
  return this;
}

Assistant:

CImg<T>& load_graphicsmagick_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_graphicsmagick_external(): Specified filename is (null).",
                                    cimg_instance);
      cimg::fclose(cimg::fopen(filename,"rb")); // Check if file exists
      CImg<charT> command(1024), filename_tmp(256);
      std::FILE *file = 0;
      const CImg<charT> s_filename = CImg<charT>::string(filename)._system_strescape();
#if cimg_OS==1
      if (!cimg::system("which gm")) {
        cimg_snprintf(command,command._width,"%s convert \"%s\" pnm:-",
                      cimg::graphicsmagick_path(),s_filename.data());
        file = popen(command,"r");
        if (file) {
          const unsigned int omode = cimg::exception_mode();
          cimg::exception_mode(0);
          try { load_pnm(file); } catch (...) {
            pclose(file);
            cimg::exception_mode(omode);
            throw CImgIOException(_cimg_instance
                                  "load_graphicsmagick_external(): Failed to load file '%s' "
                                  "with external command 'gm'.",
                                  cimg_instance,
                                  filename);
          }
          pclose(file);
          return *this;
        }
      }
#endif
      do {
        cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.pnm",
                      cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        if ((file=cimg::std_fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s convert \"%s\" \"%s\"",
                    cimg::graphicsmagick_path(),s_filename.data(),
                    CImg<charT>::string(filename_tmp)._system_strescape().data());
      cimg::system(command,cimg::graphicsmagick_path());
      if (!(file=cimg::std_fopen(filename_tmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_graphicsmagick_external(): Failed to load file '%s' with external command 'gm'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load_pnm(filename_tmp);
      std::remove(filename_tmp);
      return *this;
    }